

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O3

void __thiscall
dynamicgraph::Signal<double,_int>::setReferenceNonConstant
          (Signal<double,_int> *this,double *t,Mutex *mutexref)

{
  this->signalType = REFERENCE_NON_CONST;
  this->Treference = t;
  this->TreferenceNonConst = t;
  this->providerMutex = mutexref;
  this->copyInit = false;
  (this->super_SignalBase<int>).ready = true;
  return;
}

Assistant:

void Signal<T, Time>::setReferenceNonConstant(T *t, Mutex *mutexref) {
  signalType = REFERENCE_NON_CONST;
  Treference = t;
  TreferenceNonConst = t;
  providerMutex = mutexref;
  copyInit = false;
  setReady();
}